

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O2

void __thiscall kj::TimerImpl::TimerImpl(TimerImpl *this,TimePoint startTime)

{
  (this->super_Timer).super_MonotonicClock._vptr_MonotonicClock = (_func_int **)&PTR_now_0059ca18;
  (this->time).value.value = (long)startTime.value.value;
  heap<kj::TimerImpl::Impl>();
  (this->sleepHooks).ptr = (SleepHooks *)0x0;
  return;
}

Assistant:

TimerImpl::TimerImpl(TimePoint startTime)
    : time(startTime), impl(heap<Impl>()) {}